

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86formatter.cpp
# Opt level: O1

Error asmjit::v1_14::x86::FormatterInternal::formatInstruction
                (String *sb,FormatFlags formatFlags,BaseEmitter *emitter,Arch arch,BaseInst *inst,
                Operand_ *operands,size_t opCount)

{
  uint uVar1;
  uint uVar2;
  Error EVar3;
  Error EVar4;
  uint uVar5;
  char cVar6;
  uint uVar7;
  uint uVar8;
  uint32_t advance;
  ulong uVar9;
  char *pcVar10;
  Error unaff_EBX;
  uint uVar11;
  ulong uVar12;
  undefined1 *puVar13;
  uint uVar14;
  uint32_t uVar15;
  uint32_t count;
  Operand_ *op;
  bool bVar16;
  Operand_ local_40;
  
  uVar1 = *(uint *)inst;
  uVar2 = *(uint *)(inst + 4);
  if (0x6ba < uVar1) {
    EVar3 = String::_opFormat(sb,kAppend,"[InstId=#%u]");
    unaff_EBX = EVar3;
    goto joined_r0x00144887;
  }
  if (((uVar2 >> 0xb & 1) != 0) &&
     (unaff_EBX = String::_opString(sb,kAppend,"{vex} ",0xffffffffffffffff), unaff_EBX != 0)) {
    return unaff_EBX;
  }
  if (((uVar2 >> 10 & 1) != 0) &&
     (EVar3 = String::_opString(sb,kAppend,"{vex3} ",0xffffffffffffffff), EVar3 != 0)) {
    return EVar3;
  }
  if (((uVar2 >> 0xc & 1) != 0) &&
     (EVar3 = String::_opString(sb,kAppend,"{evex} ",0xffffffffffffffff), EVar3 != 0)) {
    return EVar3;
  }
  if ((uVar2 >> 9 & 1) == 0) {
    if ((uVar2 >> 8 & 1) != 0) {
      pcVar10 = "{modmr} ";
      goto LAB_00144f82;
    }
  }
  else {
    pcVar10 = "{modrm} ";
LAB_00144f82:
    EVar3 = String::_opString(sb,kAppend,pcVar10,0xffffffffffffffff);
    if (EVar3 != 0) {
      return EVar3;
    }
  }
  if (((uVar2 & 0x10) != 0) &&
     (EVar3 = String::_opString(sb,kAppend,"short ",0xffffffffffffffff), EVar3 != 0)) {
    return EVar3;
  }
  if (((uVar2 & 0x20) != 0) &&
     (EVar3 = String::_opString(sb,kAppend,"long ",0xffffffffffffffff), EVar3 != 0)) {
    return EVar3;
  }
  if (((uVar2 >> 0x10 & 1) != 0) &&
     (EVar3 = String::_opString(sb,kAppend,"xacquire ",0xffffffffffffffff), EVar3 != 0)) {
    return EVar3;
  }
  if (((uVar2 >> 0x11 & 1) != 0) &&
     (EVar3 = String::_opString(sb,kAppend,"xrelease ",0xffffffffffffffff), EVar3 != 0)) {
    return EVar3;
  }
  if (((uVar2 >> 0xd & 1) != 0) &&
     (EVar3 = String::_opString(sb,kAppend,"lock ",0xffffffffffffffff), EVar3 != 0)) {
    return EVar3;
  }
  if ((uVar2 & 0xc000) != 0) {
    pcVar10 = "rep ";
    if ((uVar2 >> 0xe & 1) == 0) {
      pcVar10 = "repnz ";
    }
    String::_opString(sb,kAppend,pcVar10,0xffffffffffffffff);
    if (*(int *)(inst + 8) != 0) {
      EVar3 = String::_opString(sb,kAppend,"{",0xffffffffffffffff);
      if (EVar3 != 0) {
        return EVar3;
      }
      local_40._0_8_ = *(undefined8 *)(inst + 8);
      local_40._data[0] = 0;
      local_40._data[1] = 0;
      EVar3 = formatOperand(sb,formatFlags,emitter,kUnknown,&local_40);
      if (EVar3 != 0) {
        return EVar3;
      }
      EVar3 = String::_opString(sb,kAppend,"} ",0xffffffffffffffff);
      if (EVar3 != 0) {
        return EVar3;
      }
    }
  }
  if ((uVar2 >> 0x1e & 1) != 0) {
    if ((uVar2 & 0xf000000) == 0) {
      EVar3 = String::_opString(sb,kAppend,"rex ",0xffffffffffffffff);
      bVar16 = EVar3 == 0;
      if (!bVar16) {
        unaff_EBX = EVar3;
      }
    }
    else {
      EVar3 = String::_opString(sb,kAppend,"rex.",0xffffffffffffffff);
      if (EVar3 == 0) {
        if ((uVar2 >> 0x1a & 1) != 0) {
          String::_opChar(sb,kAppend,'r');
        }
        if ((uVar2 >> 0x19 & 1) != 0) {
          String::_opChar(sb,kAppend,'x');
        }
        if ((uVar2 >> 0x18 & 1) != 0) {
          String::_opChar(sb,kAppend,'b');
        }
        if ((uVar2 >> 0x1b & 1) != 0) {
          String::_opChar(sb,kAppend,'w');
        }
        String::_opChar(sb,kAppend,' ');
        bVar16 = true;
      }
      else {
        bVar16 = false;
        unaff_EBX = EVar3;
      }
    }
    if (!bVar16) {
      return unaff_EBX;
    }
  }
  EVar3 = InstInternal::instIdToString(uVar1,sb);
joined_r0x00144887:
  if (EVar3 == 0) {
    uVar11 = 0;
    EVar3 = unaff_EBX;
    do {
      uVar12 = (ulong)uVar11;
      if (opCount <= uVar12) {
        cVar6 = '$';
        break;
      }
      if (operands[uVar12]._signature._bits == 0) {
        bVar16 = false;
        cVar6 = '$';
        goto LAB_00144946;
      }
      pcVar10 = ", ";
      if (uVar12 == 0) {
        pcVar10 = " ";
      }
      EVar4 = String::_opString(sb,kAppend,pcVar10,0xffffffffffffffff);
      if (EVar4 != 0) {
LAB_0014493b:
        cVar6 = '\x01';
        bVar16 = false;
        EVar3 = EVar4;
        goto LAB_00144946;
      }
      op = operands + uVar12;
      EVar4 = formatOperand(sb,formatFlags,emitter,kUnknown,op);
      if (EVar4 != 0) goto LAB_0014493b;
      if (((formatFlags & kExplainImms) == kNone) || (((op->_signature)._bits & 7) != 4))
      goto LAB_00144dc6;
      uVar5 = 0;
      uVar12 = 0x10;
      while( true ) {
        uVar14 = (uint)uVar12;
        if (opCount <= uVar5) break;
        uVar8 = operands[uVar5]._signature._bits;
        uVar7 = uVar8 >> 0x18;
        if (uVar7 < uVar14) {
          uVar7 = uVar14;
        }
        if ((uVar8 & 7) == 1) {
          uVar12 = (ulong)uVar7;
        }
        uVar5 = uVar5 + 1;
      }
      uVar5 = (uint)(byte)op->_data[0];
      EVar4 = 0;
      switch(uVar1) {
      case 0x4f8:
        uVar8 = uVar14 >> 2;
        if (7 < uVar14 >> 2) {
          uVar8 = 8;
        }
        goto LAB_00144da7;
      case 0x4f9:
      case 0x4fa:
      case 0x4fb:
      case 0x4fc:
      case 0x4fd:
      case 0x4ff:
      case 0x500:
      case 0x501:
      case 0x502:
      case 0x503:
      case 0x504:
      case 0x506:
      case 0x509:
      case 0x50a:
      case 0x50b:
      case 0x50c:
      case 0x50d:
      case 0x50e:
      case 0x50f:
      case 0x510:
      case 0x511:
      case 0x512:
      case 0x513:
      case 0x514:
      case 0x51d:
      case 0x51e:
      case 0x51f:
      case 0x520:
        break;
      case 0x4fe:
        goto switchD_00144b62_caseD_4fe;
      case 0x505:
switchD_00144b62_caseD_505:
        puVar13 = FormatterInternal_explainConst(asmjit::v1_14::String&,asmjit::v1_14::FormatFlags,unsigned_int,unsigned_int,asmjit::v1_14::Imm_const&)
                  ::vpclmulqdq;
LAB_00144d4e:
        uVar15 = 2;
LAB_00144d51:
        EVar4 = FormatterInternal_formatImmBits(sb,uVar5,(ImmBits *)puVar13,uVar15);
        break;
      case 0x507:
      case 0x508:
      case 0x515:
      case 0x516:
      case 0x517:
      case 0x518:
      case 0x519:
      case 0x51a:
        uVar15 = 3;
        puVar13 = "EQ";
        goto LAB_00144c3a;
      case 0x51b:
      case 0x51c:
      case 0x521:
      case 0x522:
      case 0x523:
      case 0x524:
      case 0x525:
      case 0x526:
        uVar15 = 3;
        puVar13 = "LT";
LAB_00144c3a:
        advance = 0;
        count = 1;
LAB_00144c3e:
        EVar4 = FormatterInternal_formatImmText(sb,uVar5,uVar15,advance,puVar13,count);
        break;
      default:
        uVar8 = uVar1 - 0x632;
        if (uVar8 < 0x20) {
          if ((0xb6d0000U >> (uVar8 & 0x1f) & 1) == 0) {
            if ((0xfU >> (uVar8 & 0x1f) & 1) == 0) {
              if ((0xf0000000U >> (uVar8 & 0x1f) & 1) == 0) goto LAB_001449da;
LAB_00144b9e:
              puVar13 = &FormatterInternal_explainConst(asmjit::v1_14::String&,asmjit::v1_14::FormatFlags,unsigned_int,unsigned_int,asmjit::v1_14::Imm_const&)
                         ::vroundxx;
            }
            else {
              puVar13 = &FormatterInternal_explainConst(asmjit::v1_14::String&,asmjit::v1_14::FormatFlags,unsigned_int,unsigned_int,asmjit::v1_14::Imm_const&)
                         ::vrangexx;
            }
            goto LAB_00144d4e;
          }
          puVar13 = &FormatterInternal_explainConst(asmjit::v1_14::String&,asmjit::v1_14::FormatFlags,unsigned_int,unsigned_int,asmjit::v1_14::Imm_const&)
                     ::vreducexx_vrndscalexx;
LAB_00144bfd:
          uVar15 = 3;
          goto LAB_00144d51;
        }
LAB_001449da:
        uVar8 = uVar1 - 0x45c;
        if (uVar8 < 0x22) {
          if ((0x2dUL >> ((ulong)uVar8 & 0x3f) & 1) == 0) {
            if ((0x2d0000000U >> ((ulong)uVar8 & 0x3f) & 1) != 0) {
              puVar13 = &FormatterInternal_explainConst(asmjit::v1_14::String&,asmjit::v1_14::FormatFlags,unsigned_int,unsigned_int,asmjit::v1_14::Imm_const&)
                         ::vgetmantxx;
              goto LAB_00144bfd;
            }
            goto LAB_001449ea;
          }
          puVar13 = &FormatterInternal_explainConst(asmjit::v1_14::String&,asmjit::v1_14::FormatFlags,unsigned_int,unsigned_int,asmjit::v1_14::Imm_const&)
                     ::vfpclassxx;
LAB_00144c84:
          uVar15 = 1;
          goto LAB_00144d51;
        }
LAB_001449ea:
        uVar8 = uVar1 - 0x7d;
        if (uVar8 < 0x32) {
          if ((0x33UL >> ((ulong)uVar8 & 0x3f) & 1) == 0) {
            if ((0x3000000000000U >> ((ulong)uVar8 & 0x3f) & 1) != 0)
            goto switchD_00144b62_caseD_4fe;
            goto LAB_001449f7;
          }
          uVar15 = 3;
LAB_00144c30:
          puVar13 = "EQ_OQ";
          goto LAB_00144c3a;
        }
LAB_001449f7:
        uVar9 = (ulong)(uVar1 - 0x35b);
        if (uVar1 - 0x35b < 0x37) {
          if ((0x5a0000UL >> (uVar9 & 0x3f) & 1) == 0) {
            if (uVar9 != 0) {
              if (uVar9 == 0x36) {
                puVar13 = &FormatterInternal_explainConst(asmjit::v1_14::String&,asmjit::v1_14::FormatFlags,unsigned_int,unsigned_int,asmjit::v1_14::Imm_const&)
                           ::vroundxx;
                goto LAB_00144c84;
              }
              goto LAB_00144a07;
            }
LAB_00144d19:
            uVar8 = uVar14 >> 2;
LAB_00144da7:
            uVar15 = 1;
LAB_00144db2:
            EVar4 = FormatterInternal_formatImmShuf(sb,uVar5,uVar15,uVar8);
            break;
          }
          uVar15 = 5;
          goto LAB_00144c30;
        }
LAB_00144a07:
        if (uVar1 - 0x2ba < 4) goto LAB_00144b9e;
        if (uVar1 - 0x3e6 < 4) {
          puVar13 = &FormatterInternal_explainConst(asmjit::v1_14::String&,asmjit::v1_14::FormatFlags,unsigned_int,unsigned_int,asmjit::v1_14::Imm_const&)
                     ::vfixupimmxx;
          uVar15 = 8;
          goto LAB_00144d51;
        }
        switch(uVar1) {
        case 0x545:
switchD_00144c56_caseD_545:
          uVar8 = uVar14 >> 3;
          goto LAB_00144da7;
        case 0x546:
        case 0x547:
        case 0x549:
switchD_00144c56_caseD_546:
          uVar15 = 2;
          uVar8 = 4;
          goto LAB_00144db2;
        case 0x548:
          goto switchD_00144c56_caseD_548;
        default:
          if (uVar1 - 0x673 < 4) {
            uVar8 = (uint)(uVar12 >> 4);
            if (uVar8 < 3) {
              uVar8 = 2;
            }
            uVar15 = 2 - (uVar14 < 0x30);
            goto LAB_00144db2;
          }
          if (uVar1 - 0x275 < 3) goto switchD_00144c56_caseD_546;
          if (uVar1 - 0x3cf < 2) {
switchD_00144b62_caseD_4fe:
            uVar15 = 1;
            uVar8 = 8;
            goto LAB_00144db2;
          }
          if (uVar1 - 0x539 < 2) {
            puVar13 = FormatterInternal_explainConst(asmjit::v1_14::String&,asmjit::v1_14::FormatFlags,unsigned_int,unsigned_int,asmjit::v1_14::Imm_const&)
                      ::vperm2x128;
            goto LAB_00144d4e;
          }
          if (uVar1 - 0x5fb < 2) goto switchD_00144c56_caseD_546;
          if (uVar1 - 0x61c < 2) goto switchD_00144b62_caseD_4fe;
          if (uVar1 == 0x26) goto switchD_00144c56_caseD_545;
          if (uVar1 == 0x27) goto LAB_00144d19;
          if (uVar1 == 0x1df) {
LAB_00144d22:
            uVar15 = uVar14 >> 3;
            if (3 < uVar15) {
              uVar15 = 4;
            }
            puVar13 = FormatterInternal_explainConst(asmjit::v1_14::String&,asmjit::v1_14::FormatFlags,unsigned_int,unsigned_int,asmjit::v1_14::Imm_const&)
                      ::vmpsadbw;
            goto LAB_00144d51;
          }
          if (uVar1 == 0x207) goto switchD_00144b62_caseD_4fe;
          if (uVar1 == 0x208) goto switchD_00144b62_caseD_505;
          if (uVar1 == 0x274) goto switchD_00144c56_caseD_546;
          if (uVar1 == 0x2fc) {
LAB_00144d72:
            count = uVar14 >> 3;
            if (7 < count) {
              count = 8;
            }
            uVar15 = 1;
            advance = 2;
            puVar13 = FormatterInternal_explainConst(asmjit::v1_14::String&,asmjit::v1_14::FormatFlags,unsigned_int,unsigned_int,asmjit::v1_14::Imm_const&)
                      ::vshufpd;
          }
          else {
            if ((uVar1 != 0x2fd) && (uVar1 != 0x678)) {
              if (uVar1 != 0x3c7) {
                if (uVar1 == 0x4c9) goto LAB_00144d22;
                if (uVar1 != 0x5fa) {
                  if (uVar1 != 0x677) {
                    EVar4 = 0;
                    if (uVar1 != 0x35a) goto switchD_00144c56_caseD_548;
                    goto switchD_00144c56_caseD_545;
                  }
                  goto LAB_00144d72;
                }
              }
              goto switchD_00144c56_caseD_546;
            }
            uVar15 = 2;
            puVar13 = FormatterInternal_explainConst(asmjit::v1_14::String&,asmjit::v1_14::FormatFlags,unsigned_int,unsigned_int,asmjit::v1_14::Imm_const&)
                      ::vshufps;
            advance = 4;
            count = advance;
          }
        }
        goto LAB_00144c3e;
      }
switchD_00144c56_caseD_548:
      if (EVar4 == 0) {
LAB_00144dc6:
        if (uVar11 == 0) {
          if ((*(uint *)(inst + 8) & 0xf00) == 0x200) {
            EVar4 = String::_opString(sb,kAppend," {",0xffffffffffffffff);
            if (((EVar4 != 0) ||
                (EVar4 = formatRegister(sb,formatFlags,emitter,kUnknown,(byte)inst[8] >> 3,
                                        *(uint32_t *)(inst + 0xc)), EVar4 != 0)) ||
               (EVar4 = String::_opChar(sb,kAppend,'}'), EVar4 != 0)) goto LAB_00144efb;
            if ((uVar2 >> 0x17 & 1) != 0) {
              EVar4 = String::_opString(sb,kAppend,"{z}",0xffffffffffffffff);
              goto joined_r0x00144f2c;
            }
          }
          else if ((uVar2 >> 0x17 & 1) != 0) {
            EVar4 = String::_opString(sb,kAppend," {z}",0xffffffffffffffff);
joined_r0x00144f2c:
            if (EVar4 != 0) goto LAB_00144efb;
          }
        }
        uVar5 = (op->_signature)._bits;
        if ((uVar5 & 0xe00000) == 0 || (uVar5 & 7) != 2) {
          cVar6 = '\0';
          bVar16 = true;
        }
        else {
          EVar4 = String::_opFormat(sb,kAppend," {1to%u}",
                                    (ulong)(uint)(1 << ((byte)(uVar5 >> 0x15) & 7)));
          bVar16 = EVar4 == 0;
          cVar6 = !bVar16;
          if (!bVar16) {
            EVar3 = EVar4;
          }
        }
      }
      else {
LAB_00144efb:
        cVar6 = '\x01';
        bVar16 = false;
        EVar3 = EVar4;
      }
LAB_00144946:
      uVar11 = uVar11 + 1;
    } while (bVar16);
    if (cVar6 == '$') {
      uVar1 = *(uint *)(inst + 4);
      if ((uVar1 & 0xc0000) != 0) {
        if ((uVar1 >> 0x12 & 1) == 0) {
          EVar3 = String::_opString(sb,kAppend,", {sae}",0xffffffffffffffff);
        }
        else {
          EVar3 = String::_opFormat(sb,kAppend,", {%s-sae}","rn" + (ulong)(uVar1 >> 0x15 & 3) * 3);
        }
        if (EVar3 != 0) {
          return EVar3;
        }
      }
      EVar3 = 0;
    }
  }
  return EVar3;
}

Assistant:

ASMJIT_FAVOR_SIZE Error FormatterInternal::formatInstruction(
  String& sb,
  FormatFlags formatFlags,
  const BaseEmitter* emitter,
  Arch arch,
  const BaseInst& inst, const Operand_* operands, size_t opCount) noexcept {

  InstId instId = inst.id();
  InstOptions options = inst.options();

  // Format instruction options and instruction mnemonic.
  if (instId < Inst::_kIdCount) {
    // VEX|EVEX options.
    if (Support::test(options, InstOptions::kX86_Vex))
      ASMJIT_PROPAGATE(sb.append("{vex} "));

    if (Support::test(options, InstOptions::kX86_Vex3))
      ASMJIT_PROPAGATE(sb.append("{vex3} "));

    if (Support::test(options, InstOptions::kX86_Evex))
      ASMJIT_PROPAGATE(sb.append("{evex} "));

    // MOD/RM and MOD/MR options
    if (Support::test(options, InstOptions::kX86_ModRM))
      ASMJIT_PROPAGATE(sb.append("{modrm} "));
    else if (Support::test(options, InstOptions::kX86_ModMR))
      ASMJIT_PROPAGATE(sb.append("{modmr} "));

    // SHORT|LONG options.
    if (Support::test(options, InstOptions::kShortForm))
      ASMJIT_PROPAGATE(sb.append("short "));

    if (Support::test(options, InstOptions::kLongForm))
      ASMJIT_PROPAGATE(sb.append("long "));

    // LOCK|XACQUIRE|XRELEASE options.
    if (Support::test(options, InstOptions::kX86_XAcquire))
      ASMJIT_PROPAGATE(sb.append("xacquire "));

    if (Support::test(options, InstOptions::kX86_XRelease))
      ASMJIT_PROPAGATE(sb.append("xrelease "));

    if (Support::test(options, InstOptions::kX86_Lock))
      ASMJIT_PROPAGATE(sb.append("lock "));

    // REP|REPNE options.
    if (Support::test(options, InstOptions::kX86_Rep | InstOptions::kX86_Repne)) {
      sb.append(Support::test(options, InstOptions::kX86_Rep) ? "rep " : "repnz ");
      if (inst.hasExtraReg()) {
        ASMJIT_PROPAGATE(sb.append("{"));
        ASMJIT_PROPAGATE(formatOperand(sb, formatFlags, emitter, arch, inst.extraReg().toReg<BaseReg>()));
        ASMJIT_PROPAGATE(sb.append("} "));
      }
    }

    // REX options.
    if (Support::test(options, InstOptions::kX86_Rex)) {
      const InstOptions kRXBWMask = InstOptions::kX86_OpCodeR |
                                    InstOptions::kX86_OpCodeX |
                                    InstOptions::kX86_OpCodeB |
                                    InstOptions::kX86_OpCodeW ;
      if (Support::test(options, kRXBWMask)) {
        ASMJIT_PROPAGATE(sb.append("rex."));
        if (Support::test(options, InstOptions::kX86_OpCodeR)) sb.append('r');
        if (Support::test(options, InstOptions::kX86_OpCodeX)) sb.append('x');
        if (Support::test(options, InstOptions::kX86_OpCodeB)) sb.append('b');
        if (Support::test(options, InstOptions::kX86_OpCodeW)) sb.append('w');
        sb.append(' ');
      }
      else {
        ASMJIT_PROPAGATE(sb.append("rex "));
      }
    }

    ASMJIT_PROPAGATE(InstInternal::instIdToString(instId, sb));
  }
  else {
    ASMJIT_PROPAGATE(sb.appendFormat("[InstId=#%u]", unsigned(instId)));
  }

  for (uint32_t i = 0; i < opCount; i++) {
    const Operand_& op = operands[i];
    if (op.isNone()) break;

    ASMJIT_PROPAGATE(sb.append(i == 0 ? " " : ", "));
    ASMJIT_PROPAGATE(formatOperand(sb, formatFlags, emitter, arch, op));

    if (op.isImm() && uint32_t(formatFlags & FormatFlags::kExplainImms)) {
      uint32_t vecSize = 16;
      for (uint32_t j = 0; j < opCount; j++)
        if (operands[j].isReg())
          vecSize = Support::max<uint32_t>(vecSize, operands[j].as<Reg>().size());
      ASMJIT_PROPAGATE(FormatterInternal_explainConst(sb, formatFlags, instId, vecSize, op.as<Imm>()));
    }

    // Support AVX-512 masking - {k}{z}.
    if (i == 0) {
      if (inst.extraReg().group() == RegGroup::kX86_K) {
        ASMJIT_PROPAGATE(sb.append(" {"));
        ASMJIT_PROPAGATE(formatRegister(sb, formatFlags, emitter, arch, inst.extraReg().type(), inst.extraReg().id()));
        ASMJIT_PROPAGATE(sb.append('}'));

        if (Support::test(options, InstOptions::kX86_ZMask))
          ASMJIT_PROPAGATE(sb.append("{z}"));
      }
      else if (Support::test(options, InstOptions::kX86_ZMask)) {
        ASMJIT_PROPAGATE(sb.append(" {z}"));
      }
    }

    // Support AVX-512 broadcast - {1tox}.
    if (op.isMem() && op.as<Mem>().hasBroadcast()) {
      ASMJIT_PROPAGATE(sb.appendFormat(" {1to%u}", Support::bitMask(uint32_t(op.as<Mem>().getBroadcast()))));
    }
  }

  // Support AVX-512 embedded rounding and suppress-all-exceptions {sae}.
  if (inst.hasOption(InstOptions::kX86_ER | InstOptions::kX86_SAE)) {
    if (inst.hasOption(InstOptions::kX86_ER)) {
      uint32_t bits = uint32_t(inst.options() & InstOptions::kX86_ERMask) >> Support::ConstCTZ<uint32_t(InstOptions::kX86_ERMask)>::value;

      const char roundingModes[] = "rn\0rd\0ru\0rz";
      ASMJIT_PROPAGATE(sb.appendFormat(", {%s-sae}", roundingModes + bits * 3));
    }
    else {
      ASMJIT_PROPAGATE(sb.append(", {sae}"));
    }
  }

  return kErrorOk;
}